

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O2

void convert_digit_sequence_for_numerical_reading(NJDNode *start,NJDNode *end)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _NJDNode *p_Var4;
  NJDNode *pNVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  _NJDNode *p_Var9;
  uint uVar10;
  
  p_Var9 = end->next;
  uVar6 = 0;
  for (p_Var4 = start; p_Var4 != p_Var9; p_Var4 = p_Var4->next) {
    uVar6 = uVar6 + 1;
  }
  if (1 < uVar6) {
    uVar10 = uVar6 & 3;
    if ((uVar6 & 3) == 0) {
      uVar10 = 4;
    }
    bVar2 = false;
    uVar8 = 0;
    iVar7 = uVar6 - uVar10;
    if (uVar10 <= uVar6 && iVar7 != 0) {
      if (0x47 < iVar7) {
        return;
      }
      uVar8 = (long)iVar7 / 4 & 0xffffffff;
    }
    iVar7 = uVar10 - 1;
    for (; start != p_Var9; start = start->next) {
      iVar3 = get_digit(start,0);
      if (iVar7 == 0) {
        if (iVar3 == 0) {
          NJDNode_set_pron(start,(char *)0x0);
          NJDNode_set_acc(start,0);
          NJDNode_set_mora_size(start,0);
          if (bVar2) goto LAB_00172149;
        }
        else {
LAB_00172149:
          if (0 < (int)uVar8) {
            pNVar5 = (NJDNode *)calloc(1,0x78);
            NJDNode_initialize(pNVar5);
            NJDNode_load(pNVar5,njd_set_digit_rule_numeral_list3[uVar8]);
            start = NJDNode_insert(start,start->next,pNVar5);
          }
        }
        uVar8 = (ulong)((int)uVar8 - 1);
        bVar2 = false;
      }
      else if (iVar3 < 1) {
        NJDNode_set_pron(start,(char *)0x0);
        NJDNode_set_acc(start,0);
        NJDNode_set_mora_size(start,0);
      }
      else {
        if (iVar3 == 1) {
          NJDNode_load(start,njd_set_digit_rule_numeral_list2[iVar7]);
        }
        else {
          pNVar5 = (NJDNode *)calloc(1,0x78);
          NJDNode_initialize(pNVar5);
          NJDNode_load(pNVar5,njd_set_digit_rule_numeral_list2[iVar7]);
          start = NJDNode_insert(start,start->next,pNVar5);
        }
        bVar2 = true;
      }
      bVar1 = iVar7 < 1;
      iVar7 = iVar7 + -1;
      if (bVar1) {
        iVar7 = 3;
      }
      p_Var9 = end->next;
    }
  }
  return;
}

Assistant:

static void convert_digit_sequence_for_numerical_reading(NJDNode * start, NJDNode * end)
{
   NJDNode *node;
   NJDNode *newnode;
   int digit;
   int place = 0;
   int index;
   int size = 0;
   int have = 0;

   for (node = start; node != end->next; node = node->next)
      size++;
   if (size <= 1)
      return;

   index = size % 4;
   if (index == 0)
      index = 4;
   if (size > index)
      place = (size - index) / 4;
   index--;
   if (place > 17)
      return;

   for (node = start; node != end->next; node = node->next) {
      digit = get_digit(node, 0);
      if (index == 0) {
         if (digit == 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else {
            have = 1;
         }
         if (have == 1) {
            if (place > 0) {
               newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
               NJDNode_initialize(newnode);
               NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list3[place]);
               node = NJDNode_insert(node, node->next, newnode);
            }
            have = 0;
         }
         place--;
      } else {
         if (digit <= 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else if (digit == 1) {
            NJDNode_load(node, (char *) njd_set_digit_rule_numeral_list2[index]);
            have = 1;
         } else {
            newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
            NJDNode_initialize(newnode);
            NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list2[index]);
            node = NJDNode_insert(node, node->next, newnode);
            have = 1;
         }
      }
      index--;
      if (index < 0)
         index = 4 - 1;
   }
}